

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

ColorRole __thiscall QWidget::backgroundRole(QWidget *this)

{
  uint uVar1;
  ColorRole in_ECX;
  int iVar2;
  ColorRole CVar3;
  
  while( true ) {
    iVar2 = 1;
    CVar3 = (ColorRole)*(byte *)(*(long *)&this->field_0x8 + 0x251);
    if ((CVar3 == NoRole) &&
       (uVar1 = (this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                super_QFlagsStorage<Qt::WindowType>.i, iVar2 = 2, CVar3 = in_ECX,
       (uVar1 & 1) == 0 && (uVar1 & 0xff) != 0x12)) {
      this = *(QWidget **)(*(long *)&this->field_0x8 + 0x10);
      iVar2 = 0;
    }
    if (iVar2 != 0) break;
    in_ECX = CVar3;
    if (this == (QWidget *)0x0) {
      return Window;
    }
  }
  if (iVar2 == 2) {
    return Window;
  }
  return CVar3;
}

Assistant:

QPalette::ColorRole QWidget::backgroundRole() const
{

    const QWidget *w = this;
    do {
        QPalette::ColorRole role = w->d_func()->bg_role;
        if (role != QPalette::NoRole)
            return role;
        if (w->isWindow() || w->windowType() == Qt::SubWindow)
            break;
        w = w->parentWidget();
    } while (w);
    return QPalette::Window;
}